

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_group_delay.cc
# Opt level: O3

bool __thiscall
sptk::FilterCoefficientsToGroupDelay::Run
          (FilterCoefficientsToGroupDelay *this,
          vector<double,_std::allocator<double>_> *numerator_coefficients,
          vector<double,_std::allocator<double>_> *denominator_coefficients,
          vector<double,_std::allocator<double>_> *group_delay,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  double __y;
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  double *pdVar8;
  pointer pdVar9;
  uint uVar10;
  size_type sVar11;
  ulong uVar12;
  pointer pdVar13;
  ulong uVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  double __x;
  
  if ((this->is_valid_ == true) &&
     ((long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 == (long)this->num_numerator_order_ + 1)) {
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    if (group_delay == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    if ((long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_start >> 3 !=
        (long)this->num_denominator_order_ + 1) {
      return false;
    }
    iVar1 = this->fft_length_;
    uVar6 = iVar1 / 2 + 1;
    iVar7 = iVar1;
    if ((long)(group_delay->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(group_delay->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)(int)uVar6) {
      std::vector<double,_std::allocator<double>_>::resize(group_delay,(long)(int)uVar6);
      iVar7 = this->fft_length_;
    }
    this_00 = &buffer->real_part1_;
    sVar11 = (size_type)iVar7;
    if ((long)(buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != sVar11) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,sVar11);
      sVar11 = (size_type)this->fft_length_;
    }
    this_02 = &buffer->real_part2_;
    if ((long)(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != sVar11) {
      std::vector<double,_std::allocator<double>_>::resize(this_02,sVar11);
    }
    this_01 = &buffer->flipped_coefficients_;
    pdVar8 = (buffer->flipped_coefficients_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar11 = (long)this->num_denominator_order_ + 1;
    if ((long)(buffer->flipped_coefficients_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8 >> 3 != sVar11) {
      std::vector<double,_std::allocator<double>_>::resize(this_01,sVar11);
      pdVar8 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    pdVar2 = (denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl
             .super__Vector_impl_data._M_start;
    for (pdVar9 = (denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_finish; pdVar9 != pdVar2 + 1;
        pdVar9 = pdVar9 + -1) {
      *pdVar8 = pdVar9[-1];
      pdVar8 = pdVar8 + 1;
    }
    (buffer->flipped_coefficients_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = 1.0;
    bVar5 = Perform1DConvolution(numerator_coefficients,this_01,&buffer->convolved_coefficients_);
    if (bVar5) {
      pdVar2 = (buffer->convolved_coefficients_).super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar9 = (buffer->convolved_coefficients_).super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar14 = (long)pdVar9 - (long)pdVar2;
      if (uVar14 != 0) {
        memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,pdVar2,uVar14);
      }
      pdVar3 = (buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar15 = (long)(uVar14 * 0x20000000) >> 0x1d;
      pdVar13 = (pointer)((long)(buffer->real_part1_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar15);
      if (pdVar13 != pdVar3) {
        memset(pdVar13,0,((long)pdVar3 + (-8 - (long)pdVar13) & 0xfffffffffffffff8U) + 8);
      }
      pdVar3 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (uint)((ulong)((long)pdVar9 - (long)pdVar2) >> 3);
      if (0 < (int)uVar10) {
        pdVar2 = (buffer->convolved_coefficients_).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar12 = 0;
        do {
          pdVar3[uVar12] = (double)(int)uVar12 * pdVar2[uVar12];
          uVar12 = uVar12 + 1;
        } while ((uVar10 & 0x7fffffff) != uVar12);
      }
      pdVar2 = (buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar3 + (int)(uVar14 >> 3) != pdVar2) {
        memset(pdVar3 + (int)(uVar14 >> 3),0,
               ((long)pdVar2 + (-8 - (lVar15 + (long)pdVar3)) & 0xfffffffffffffff8U) + 8);
      }
      bVar5 = RealValuedFastFourierTransform::Run
                        (&this->fast_fourier_transform_,this_00,&buffer->imag_part1_,
                         &buffer->buffer_for_fast_fourier_transform_);
      if (bVar5) {
        bVar5 = RealValuedFastFourierTransform::Run
                          (&this->fast_fourier_transform_,this_02,&buffer->imag_part2_,
                           &buffer->buffer_for_fast_fourier_transform_);
        if (bVar5) {
          if (iVar1 < -1) {
            return true;
          }
          pdVar2 = (group_delay->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar9 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar13 = (buffer->imag_part1_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar4 = (buffer->imag_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          uVar14 = 0;
          do {
            dVar17 = pdVar9[uVar14];
            dVar16 = pdVar13[uVar14];
            __x = dVar17 * dVar17 + dVar16 * dVar16;
            __y = this->gamma_;
            if ((__y != 1.0) || (NAN(__y))) {
              __x = pow(__x,__y);
              dVar17 = pdVar9[uVar14];
              dVar16 = pdVar13[uVar14];
            }
            dVar16 = (dVar17 * pdVar3[uVar14] + dVar16 * pdVar4[uVar14]) / __x -
                     (double)this->num_denominator_order_;
            pdVar2[uVar14] = dVar16;
            dVar17 = this->alpha_;
            if ((dVar17 != 1.0) || (NAN(dVar17))) {
              if (dVar16 <= 0.0) {
                dVar17 = pow(-dVar16,dVar17);
                dVar17 = -dVar17;
              }
              else {
                dVar17 = pow(dVar16,dVar17);
              }
              pdVar2[uVar14] = dVar17;
            }
            uVar14 = uVar14 + 1;
          } while (uVar6 != uVar14);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool FilterCoefficientsToGroupDelay::Run(
    const std::vector<double>& numerator_coefficients,
    const std::vector<double>& denominator_coefficients,
    std::vector<double>* group_delay,
    FilterCoefficientsToGroupDelay::Buffer* buffer) const {
  // Check inputs.
  const int numerator_length(num_numerator_order_ + 1);
  const int denominator_length(num_denominator_order_ + 1);
  if (!is_valid_ ||
      numerator_coefficients.size() !=
          static_cast<std::size_t>(numerator_length) ||
      denominator_coefficients.size() !=
          static_cast<std::size_t>(denominator_length) ||
      NULL == group_delay || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(fft_length_ / 2 + 1);
  if (group_delay->size() != static_cast<std::size_t>(output_length)) {
    group_delay->resize(output_length);
  }
  if (buffer->real_part1_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part1_.resize(fft_length_);
  }
  if (buffer->real_part2_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part2_.resize(fft_length_);
  }
  if (buffer->flipped_coefficients_.size() !=
      static_cast<std::size_t>(num_denominator_order_ + 1)) {
    buffer->flipped_coefficients_.resize(num_denominator_order_ + 1);
  }

  std::reverse_copy(denominator_coefficients.begin() + 1,
                    denominator_coefficients.end(),
                    buffer->flipped_coefficients_.begin());
  buffer->flipped_coefficients_.back() = 1.0;

  if (!Perform1DConvolution(numerator_coefficients,
                            buffer->flipped_coefficients_,
                            &buffer->convolved_coefficients_)) {
    return false;
  }
  const int coefficients_length(
      static_cast<int>(buffer->convolved_coefficients_.size()));

  std::copy(buffer->convolved_coefficients_.begin(),
            buffer->convolved_coefficients_.end(), buffer->real_part1_.begin());
  std::fill(buffer->real_part1_.begin() + coefficients_length,
            buffer->real_part1_.end(), 0.0);

  // Make ramped polynomial.
  {
    const double* src(&buffer->convolved_coefficients_[0]);
    double* dst(&buffer->real_part2_[0]);
    for (int i(0); i < coefficients_length; ++i) {
      dst[i] = i * src[i];
    }
  }
  std::fill(buffer->real_part2_.begin() + coefficients_length,
            buffer->real_part2_.end(), 0.0);

  if (!fast_fourier_transform_.Run(
          &buffer->real_part1_, &buffer->imag_part1_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  if (!fast_fourier_transform_.Run(
          &buffer->real_part2_, &buffer->imag_part2_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  double* output(&((*group_delay)[0]));
  const double* xr(&buffer->real_part1_[0]);
  const double* yr(&buffer->real_part2_[0]);
  const double* xi(&buffer->imag_part1_[0]);
  const double* yi(&buffer->imag_part2_[0]);

  for (int i(0); i < output_length; ++i) {
    double denominator(xr[i] * xr[i] + xi[i] * xi[i]);
    if (1.0 != gamma_) {
      denominator = std::pow(denominator, gamma_);
    }
    double numerator(xr[i] * yr[i] + xi[i] * yi[i]);
    output[i] = numerator / denominator - num_denominator_order_;
    if (1.0 != alpha_) {
      output[i] = (0.0 < output[i]) ? std::pow(output[i], alpha_)
                                    : -std::pow(-output[i], alpha_);
    }
  }

  return true;
}